

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O1

void Gia_ManSpeedupObj(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vLeaves,
                      Vec_Int_t *vTimes)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  Vec_Int_t *vNodes;
  int *piVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  Gia_Obj_t *pGVar13;
  long lVar14;
  long lVar15;
  int pCofs [32];
  uint local_b8 [34];
  
  Gia_ManIncrementTravId(p);
  if (0 < p->nObjs) {
    if (p->nTravIdsAlloc < 1) {
LAB_0071cb94:
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x227,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    pGVar2 = p->pObjs;
    piVar9 = p->pTravIds;
    *piVar9 = p->nTravIds;
    if (vLeaves->nSize < 1) {
      pGVar13 = (Gia_Obj_t *)0x0;
    }
    else {
      piVar3 = vLeaves->pArray;
      pGVar13 = (Gia_Obj_t *)0x0;
      lVar14 = 0;
      do {
        iVar6 = piVar3[lVar14];
        lVar15 = (long)iVar6;
        if ((lVar15 < 0) || (p->nObjs <= iVar6)) goto LAB_0071cb18;
        if (pGVar2 == (Gia_Obj_t *)0x0) goto LAB_0071c727;
        if (p->nTravIdsAlloc <= iVar6) goto LAB_0071cb94;
        piVar9[lVar15] = p->nTravIds;
        lVar14 = lVar14 + 1;
      } while (lVar14 < vLeaves->nSize);
      pGVar13 = pGVar2 + lVar15;
    }
LAB_0071c727:
    vNodes = (Vec_Int_t *)malloc(0x10);
    vNodes->nCap = 100;
    vNodes->nSize = 0;
    piVar9 = (int *)malloc(400);
    vNodes->pArray = piVar9;
    iVar6 = Gia_ManSpeedupObj_rec(p,pObj,vNodes);
    if (iVar6 == 0) {
      puts("Bad node!!!");
      if (vNodes->pArray != (int *)0x0) {
        free(vNodes->pArray);
        vNodes->pArray = (int *)0x0;
      }
      free(vNodes);
      return;
    }
    iVar6 = vTimes->nSize;
    uVar7 = 1 << ((byte)iVar6 & 0x1f);
    if (iVar6 != 0x1f) {
      uVar11 = 1;
      if (1 < (int)uVar7) {
        uVar11 = (ulong)uVar7;
      }
      uVar12 = 0;
      do {
        iVar10 = vLeaves->nSize;
        if (0 < (long)iVar10) {
          piVar9 = vLeaves->pArray;
          lVar14 = 0;
          do {
            iVar1 = piVar9[lVar14];
            lVar15 = (long)iVar1;
            if ((lVar15 < 0) || (p->nObjs <= iVar1)) goto LAB_0071cb18;
            pGVar13 = p->pObjs;
            if (pGVar13 == (Gia_Obj_t *)0x0) {
              pGVar13 = (Gia_Obj_t *)0x0;
              goto LAB_0071c7fe;
            }
            pGVar13[lVar15].Value = iVar1 * 2;
            lVar14 = lVar14 + 1;
          } while (iVar10 != lVar14);
          pGVar13 = pGVar13 + lVar15;
        }
LAB_0071c7fe:
        iVar10 = vTimes->nSize;
        if (0 < (long)iVar10) {
          piVar9 = vTimes->pArray;
          lVar14 = 0;
          do {
            lVar15 = (long)piVar9[lVar14];
            if ((lVar15 < 0) || (p->nObjs <= piVar9[lVar14])) goto LAB_0071cb18;
            pGVar13 = p->pObjs;
            if (pGVar13 == (Gia_Obj_t *)0x0) {
              pGVar13 = (Gia_Obj_t *)0x0;
              goto LAB_0071c85b;
            }
            pGVar13[lVar15].Value = (uint)(((uint)uVar12 >> ((uint)lVar14 & 0x1f) & 1) != 0);
            lVar14 = lVar14 + 1;
          } while (iVar10 != lVar14);
          pGVar13 = pGVar13 + lVar15;
        }
LAB_0071c85b:
        if (0 < vNodes->nSize) {
          lVar14 = 0;
          do {
            iVar10 = vNodes->pArray[lVar14];
            if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_0071cb18;
            pGVar13 = p->pObjs + iVar10;
            uVar4 = *(ulong *)pGVar13;
            if (((int)pGVar13[-(ulong)((uint)uVar4 & 0x1fffffff)].Value < 0) ||
               (uVar8 = (uint)(uVar4 >> 0x20), (int)pGVar13[-(ulong)(uVar8 & 0x1fffffff)].Value < 0)
               ) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10f,"int Abc_LitNotCond(int, int)");
            }
            uVar8 = Gia_ManHashAnd(pNew,(uint)(uVar4 >> 0x1d) & 1 ^
                                        pGVar13[-(ulong)((uint)uVar4 & 0x1fffffff)].Value,
                                   pGVar13[-(ulong)(uVar8 & 0x1fffffff)].Value ^ uVar8 >> 0x1d & 1);
            pGVar13->Value = uVar8;
            lVar14 = lVar14 + 1;
          } while (lVar14 < vNodes->nSize);
        }
        local_b8[uVar12] = pGVar13->Value;
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar11);
    }
    if (vNodes->pArray != (int *)0x0) {
      free(vNodes->pArray);
      vNodes->pArray = (int *)0x0;
    }
    free(vNodes);
    if (0 < vTimes->nSize) {
      lVar14 = 0;
      do {
        iVar10 = vTimes->pArray[lVar14];
        if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) {
LAB_0071cb18:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (iVar6 != 0x1f) {
          pGVar2 = p->pObjs + iVar10;
          pGVar13 = (Gia_Obj_t *)((ulong)pGVar2 & 0xfffffffffffffffe);
          lVar15 = 0;
          do {
            pGVar5 = p->pObjs;
            if ((pGVar13 < pGVar5) || (pGVar5 + p->nObjs <= pGVar13)) goto LAB_0071cb56;
            iVar10 = (int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2);
            if (iVar10 * -0x55555555 < 0) {
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10b,"int Abc_Var2Lit(int, int)");
            }
            uVar8 = Gia_ManHashMux(pNew,((uint)pGVar2 & 1) + iVar10 * 0x55555556,
                                   local_b8[(1 << ((byte)lVar14 & 0x1f)) + lVar15],local_b8[lVar15])
            ;
            local_b8[lVar15] = uVar8;
            lVar15 = lVar15 + (2 << ((byte)lVar14 & 0x1f));
          } while (lVar15 < (int)uVar7);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < vTimes->nSize);
    }
    pGVar2 = p->pObjs;
    if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->nObjs)) {
      if (-1 < (int)local_b8[0]) {
        uVar7 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
        local_b8[0] = local_b8[0] >> 1;
        if ((int)uVar7 < (int)local_b8[0]) {
          pNew->pReprs[local_b8[0]] =
               (Gia_Rpr_t)((uint)pNew->pReprs[local_b8[0]] & 0xf0000000 | uVar7 & 0xfffffff);
          piVar9 = pNew->pNexts;
          piVar9[local_b8[0]] = piVar9[(int)uVar7];
          piVar9[(int)uVar7] = local_b8[0];
        }
        return;
      }
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10c,"int Abc_Lit2Var(int)");
    }
  }
LAB_0071cb56:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManSpeedupObj( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vLeaves, Vec_Int_t * vTimes )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pTemp = NULL;
    int pCofs[32], nCofs, nSkip, i, k, iResult, iObj;
    // mark the leaves
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Gia_ManForEachObjVec( vLeaves, p, pTemp, i )
        Gia_ObjSetTravIdCurrent( p, pTemp );
    // collect the AIG nodes
    vNodes = Vec_IntAlloc( 100 );
    if ( !Gia_ManSpeedupObj_rec( p, pObj, vNodes ) )
    {
        printf( "Bad node!!!\n" );
        Vec_IntFree( vNodes );
        return;
    }
    // derive cofactors
    nCofs = (1 << Vec_IntSize(vTimes));
    for ( i = 0; i < nCofs; i++ )
    {
        Gia_ManForEachObjVec( vLeaves, p, pTemp, k )
            pTemp->Value = Abc_Var2Lit( Gia_ObjId(p, pTemp), 0 );
        Gia_ManForEachObjVec( vTimes, p, pTemp, k )
            pTemp->Value = ((i & (1<<k)) != 0);
        Gia_ManForEachObjVec( vNodes, p, pTemp, k )
            pTemp->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pTemp), Gia_ObjFanin1Copy(pTemp) );
        pCofs[i] = pTemp->Value;
    }
    Vec_IntFree( vNodes );
    // collect the resulting tree
    Gia_ManForEachObjVec( vTimes, p, pTemp, k )
        for ( nSkip = (1<<k), i = 0; i < nCofs; i += 2*nSkip )
            pCofs[i] = Gia_ManHashMux( pNew, Gia_ObjToLit(p,pTemp), pCofs[i+nSkip], pCofs[i] );
    // create choice node  (pObj is repr and ppCofs[0] is new)
    iObj    = Gia_ObjId( p, pObj );
    iResult = Abc_Lit2Var( pCofs[0] );
    if ( iResult <= iObj )
        return;
    Gia_ObjSetRepr( pNew, iResult, iObj );
    Gia_ObjSetNext( pNew, iResult, Gia_ObjNext(pNew, iObj) );
    Gia_ObjSetNext( pNew, iObj, iResult );
}